

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.h
# Opt level: O0

BBlockInfo * __thiscall
dg::dda::MemorySSATransformation::getBBlockInfo(MemorySSATransformation *this,RWBBlock *b)

{
  SubgraphInfo *pSVar1;
  BBlockInfo *pBVar2;
  RWBBlock *in_RSI;
  SubgraphInfo *unaff_retaddr;
  SubgraphInfo *si;
  RWBBlock *in_stack_fffffffffffffff8;
  
  RWBBlock::getSubgraph(in_RSI);
  pSVar1 = getSubgraphInfo((MemorySSATransformation *)unaff_retaddr,
                           (RWSubgraph *)in_stack_fffffffffffffff8);
  if (pSVar1 == (SubgraphInfo *)0x0) {
    pBVar2 = (BBlockInfo *)0x0;
  }
  else {
    pBVar2 = SubgraphInfo::getBBlockInfo(unaff_retaddr,in_stack_fffffffffffffff8);
  }
  return pBVar2;
}

Assistant:

const BBlockInfo *getBBlockInfo(RWBBlock *b) const {
        const auto *si = getSubgraphInfo(b->getSubgraph());
        if (si) {
            return si->getBBlockInfo(b);
        }
        return nullptr;
    }